

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::EvaluateInterfaceProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *prop,
          cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagCheckerParent,
          LinkInterfaceFor interfaceFor)

{
  bool evaluateForBuildsystem;
  pointer pcVar1;
  bool bVar2;
  Result RVar3;
  string *__rhs;
  long *plVar4;
  cmGeneratorTarget *headTarget;
  cmValue prop_00;
  cmLinkInterfaceLibraries *pcVar5;
  size_type *psVar6;
  element_type *peVar7;
  cmGeneratorTarget *this_00;
  pointer pcVar8;
  pointer pcVar9;
  string libResult;
  string local_2e8;
  cmGeneratorTarget *local_2c8;
  string local_2c0;
  cmListFileBacktrace local_2a0;
  cmListFileBacktrace local_290;
  string local_280;
  pointer local_260;
  cmLocalGenerator *local_258;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  cmGeneratorExpressionContext libContext;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2c8 = this;
  bVar2 = MaybeHaveInterfaceProperty(this,prop,context,interfaceFor);
  if (bVar2) {
    local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (context->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (context->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pcVar1 = (prop->_M_dataplus)._M_p;
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,pcVar1,pcVar1 + prop->_M_string_length);
    this_00 = local_2c8;
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,&local_290,local_2c8,&local_250,(GeneratorExpressionContent *)0x0,
               dagCheckerParent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_290.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    RVar3 = cmGeneratorExpressionDAGChecker::Check(&dagChecker);
    if (1 < RVar3 - CYCLIC_REFERENCE) {
      if (RVar3 == SELF_REFERENCE) {
        __rhs = cmTarget::GetName_abi_cxx11_(this_00->Target);
        std::operator+(&local_230,"$<TARGET_PROPERTY:",__rhs);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_2e8.field_2._M_allocated_capacity = *psVar6;
          local_2e8.field_2._8_8_ = plVar4[3];
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar6;
          local_2e8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_2e8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2e8,(ulong)(prop->_M_dataplus)._M_p);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          libResult.field_2._M_allocated_capacity = *psVar6;
          libResult.field_2._8_8_ = plVar4[3];
          libResult._M_dataplus._M_p = (pointer)&libResult.field_2;
        }
        else {
          libResult.field_2._M_allocated_capacity = *psVar6;
          libResult._M_dataplus._M_p = (pointer)*plVar4;
        }
        libResult._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&libResult);
        peVar7 = (element_type *)(plVar4 + 2);
        if ((element_type *)*plVar4 == peVar7) {
          libContext.DependTargets._M_t._M_impl._0_8_ = (peVar7->Value).Name._M_dataplus._M_p;
          libContext.DependTargets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar4[3];
          libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)&libContext.DependTargets;
        }
        else {
          libContext.DependTargets._M_t._M_impl._0_8_ = (peVar7->Value).Name._M_dataplus._M_p;
          libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)*plVar4;
        }
        libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
        *plVar4 = (long)peVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        cmGeneratorExpressionDAGChecker::ReportError(&dagChecker,context,(string *)&libContext);
        if (libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
            .
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)&libContext.DependTargets) {
          operator_delete(libContext.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,libContext.DependTargets._M_t._M_impl._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)libResult._M_dataplus._M_p != &libResult.field_2) {
          operator_delete(libResult._M_dataplus._M_p,libResult.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        headTarget = context->HeadTarget;
        if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
          headTarget = this_00;
        }
        prop_00 = GetProperty(this_00,prop);
        if (prop_00.Value != (string *)0x0) {
          cmGeneratorExpressionNode::EvaluateDependentExpression
                    ((string *)&libContext,prop_00.Value,context->LG,context,headTarget,&dagChecker,
                     this_00);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&libContext);
          if (libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)&libContext.DependTargets) {
            operator_delete(libContext.Backtrace.
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,libContext.DependTargets._M_t._M_impl._0_8_ + 1);
          }
        }
        pcVar5 = GetLinkInterfaceLibraries(this_00,&context->Config,headTarget,interfaceFor);
        if (pcVar5 != (cmLinkInterfaceLibraries *)0x0) {
          bVar2 = true;
          if (context->HadContextSensitiveCondition == false) {
            bVar2 = pcVar5->HadContextSensitiveCondition;
          }
          context->HadContextSensitiveCondition = bVar2;
          pcVar8 = (pcVar5->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar9 = (pcVar5->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pcVar8 != pcVar9) {
            local_260 = pcVar9;
            do {
              if (pcVar8->Target != this_00 && pcVar8->Target != (cmGeneratorTarget *)0x0) {
                local_258 = context->LG;
                local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
                pcVar1 = (context->Config)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_280,pcVar1,pcVar1 + (context->Config)._M_string_length);
                bVar2 = context->Quiet;
                evaluateForBuildsystem = context->EvaluateForBuildsystem;
                local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (context->Backtrace).
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (context->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                     .TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
                if (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                          TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
                pcVar1 = (context->Language)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2c0,pcVar1,pcVar1 + (context->Language)._M_string_length
                          );
                this_00 = local_2c8;
                cmGeneratorExpressionContext::cmGeneratorExpressionContext
                          (&libContext,local_258,&local_280,bVar2,headTarget,local_2c8,
                           evaluateForBuildsystem,&local_2a0,&local_2c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
                  operator_delete(local_2c0._M_dataplus._M_p,
                                  local_2c0.field_2._M_allocated_capacity + 1);
                }
                if (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_2a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                             TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_280._M_dataplus._M_p != &local_280.field_2) {
                  operator_delete(local_280._M_dataplus._M_p,
                                  local_280.field_2._M_allocated_capacity + 1);
                }
                EvaluateInterfaceProperty
                          (&local_2e8,pcVar8->Target,prop,&libContext,&dagChecker,interfaceFor);
                cmGeneratorExpression::StripEmptyListElements(&libResult,&local_2e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                  operator_delete(local_2e8._M_dataplus._M_p,
                                  local_2e8.field_2._M_allocated_capacity + 1);
                }
                if (libResult._M_string_length != 0) {
                  if (__return_storage_ptr__->_M_string_length == 0) {
                    std::__cxx11::string::operator=
                              ((string *)__return_storage_ptr__,(string *)&libResult);
                  }
                  else {
                    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
                    std::__cxx11::string::append((char *)__return_storage_ptr__);
                    std::__cxx11::string::_M_append
                              ((char *)__return_storage_ptr__,(ulong)libResult._M_dataplus._M_p);
                  }
                }
                bVar2 = libContext.HadContextSensitiveCondition;
                if (context->HadContextSensitiveCondition != false) {
                  bVar2 = true;
                }
                context->HadContextSensitiveCondition = bVar2;
                bVar2 = libContext.HadHeadSensitiveCondition;
                if (context->HadHeadSensitiveCondition != false) {
                  bVar2 = true;
                }
                context->HadHeadSensitiveCondition = bVar2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)libResult._M_dataplus._M_p != &libResult.field_2) {
                  operator_delete(libResult._M_dataplus._M_p,
                                  libResult.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)libContext.Language._M_dataplus._M_p != &libContext.Language.field_2) {
                  operator_delete(libContext.Language._M_dataplus._M_p,
                                  libContext.Language.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)libContext.Config._M_dataplus._M_p != &libContext.Config.field_2) {
                  operator_delete(libContext.Config._M_dataplus._M_p,
                                  libContext.Config.field_2._M_allocated_capacity + 1);
                }
                std::
                _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                ::~_Rb_tree(&libContext.MaxLanguageStandard._M_t);
                std::
                _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                ::~_Rb_tree(&libContext.SourceSensitiveTargets._M_t);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree(&libContext.SeenTargetProperties._M_t);
                std::
                _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                ::~_Rb_tree(&libContext.AllTargets._M_t);
                std::
                _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                ::~_Rb_tree(&libContext.DependTargets._M_t);
                pcVar9 = local_260;
                if (libContext.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                    TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (libContext.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                  pcVar9 = local_260;
                }
              }
              pcVar8 = pcVar8 + 1;
            } while (pcVar8 != pcVar9);
          }
        }
      }
    }
    if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::EvaluateInterfaceProperty(
  std::string const& prop, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagCheckerParent,
  LinkInterfaceFor interfaceFor) const
{
  std::string result;

  // If the property does not appear transitively at all, we are done.
  if (!this->MaybeHaveInterfaceProperty(prop, context, interfaceFor)) {
    return result;
  }

  // Evaluate $<TARGET_PROPERTY:this,prop> as if it were compiled.  This is
  // a subset of TargetPropertyNode::Evaluate without stringify/parse steps
  // but sufficient for transitive interface properties.
  cmGeneratorExpressionDAGChecker dagChecker(context->Backtrace, this, prop,
                                             nullptr, dagCheckerParent);
  switch (dagChecker.Check()) {
    case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
      dagChecker.ReportError(
        context, "$<TARGET_PROPERTY:" + this->GetName() + "," + prop + ">");
      return result;
    case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
      // No error. We just skip cyclic references.
    case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
      // No error. We have already seen this transitive property.
      return result;
    case cmGeneratorExpressionDAGChecker::DAG:
      break;
  }

  cmGeneratorTarget const* headTarget =
    context->HeadTarget ? context->HeadTarget : this;

  if (cmValue p = this->GetProperty(prop)) {
    result = cmGeneratorExpressionNode::EvaluateDependentExpression(
      *p, context->LG, context, headTarget, &dagChecker, this);
  }

  if (cmLinkInterfaceLibraries const* iface = this->GetLinkInterfaceLibraries(
        context->Config, headTarget, interfaceFor)) {
    context->HadContextSensitiveCondition =
      context->HadContextSensitiveCondition ||
      iface->HadContextSensitiveCondition;
    for (cmLinkItem const& lib : iface->Libraries) {
      // Broken code can have a target in its own link interface.
      // Don't follow such link interface entries so as not to create a
      // self-referencing loop.
      if (lib.Target && lib.Target != this) {
        // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in the
        // above property and hand-evaluate it as if it were compiled.
        // Create a context as cmCompiledGeneratorExpression::Evaluate does.
        cmGeneratorExpressionContext libContext(
          context->LG, context->Config, context->Quiet, headTarget, this,
          context->EvaluateForBuildsystem, context->Backtrace,
          context->Language);
        std::string libResult = cmGeneratorExpression::StripEmptyListElements(
          lib.Target->EvaluateInterfaceProperty(prop, &libContext, &dagChecker,
                                                interfaceFor));
        if (!libResult.empty()) {
          if (result.empty()) {
            result = std::move(libResult);
          } else {
            result.reserve(result.size() + 1 + libResult.size());
            result += ";";
            result += libResult;
          }
        }
        context->HadContextSensitiveCondition =
          context->HadContextSensitiveCondition ||
          libContext.HadContextSensitiveCondition;
        context->HadHeadSensitiveCondition =
          context->HadHeadSensitiveCondition ||
          libContext.HadHeadSensitiveCondition;
      }
    }
  }

  return result;
}